

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

StringView __thiscall
anon_unknown.dwarf_4447fb::ExpandedSpecialSubstitution::getBaseName
          (ExpandedSpecialSubstitution *this)

{
  StringView SVar1;
  ExpandedSpecialSubstitution *this_local;
  
  SVar1 = (StringView)
          (*(code *)(&DAT_0037a298 +
                    *(int *)(&DAT_0037a298 + (ulong)*(uint *)&(this->super_Node).field_0xc * 4)))();
  return SVar1;
}

Assistant:

StringView getBaseName() const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      return StringView("allocator");
    case SpecialSubKind::basic_string:
      return StringView("basic_string");
    case SpecialSubKind::string:
      return StringView("basic_string");
    case SpecialSubKind::istream:
      return StringView("basic_istream");
    case SpecialSubKind::ostream:
      return StringView("basic_ostream");
    case SpecialSubKind::iostream:
      return StringView("basic_iostream");
    }
    LLVM_BUILTIN_UNREACHABLE;
  }